

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3FindInIndex(Parse *pParse,Expr *pX,u32 inFlags,int *prRhsHasNull,int *aiMap,int *piTab)

{
  byte bVar1;
  byte bVar2;
  short sVar3;
  ushort uVar4;
  u32 uVar5;
  ExprList *pEVar6;
  SrcList *pSVar7;
  Table *pTab;
  Schema *pSVar8;
  char cVar9;
  int iVar10;
  Vdbe *p;
  Select *pSVar11;
  Expr *pEVar12;
  Expr *pLeft;
  CollSeq *pCVar13;
  u8 uVar14;
  char aff2;
  uint uVar15;
  Schema **ppSVar16;
  ulong uVar17;
  Op *pOVar18;
  int iVar19;
  int iVar20;
  long lVar21;
  long lVar22;
  ExprList_item *pEVar23;
  int iCur;
  Index *pIdx;
  uint uVar24;
  ulong uVar25;
  bool bVar26;
  int *local_a8;
  Walker local_60;
  
  p = sqlite3GetVdbe(pParse);
  iCur = pParse->nTab;
  pParse->nTab = iCur + 1;
  iVar20 = 0;
  if (prRhsHasNull == (int *)0x0) {
    local_a8 = (int *)0x0;
  }
  else {
    local_a8 = prRhsHasNull;
    if ((pX->flags & 0x1000) != 0) {
      pEVar6 = ((pX->x).pSelect)->pEList;
      uVar15 = pEVar6->nExpr;
      if ((int)uVar15 < 1) {
        uVar24 = 0;
      }
      else {
        pEVar23 = pEVar6->a;
        uVar25 = 0;
        do {
          iVar10 = sqlite3ExprCanBeNull(pEVar23->pExpr);
          if (iVar10 != 0) goto LAB_0016afb7;
          uVar25 = uVar25 + 1;
          pEVar23 = pEVar23 + 1;
        } while (uVar15 != uVar25);
        uVar25 = (ulong)uVar15;
LAB_0016afb7:
        uVar24 = (uint)uVar25;
      }
      if (uVar24 == uVar15) {
        local_a8 = (int *)0x0;
      }
    }
  }
  if (pParse->nErr == 0) {
    iVar20 = 0;
    if (((((((pX->flags & 0x1040) == 0x1000) &&
           (pSVar11 = (pX->x).pSelect, pSVar11->pPrior == (Select *)0x0)) &&
          ((pSVar11->selFlags & 9) == 0)) &&
         ((pSVar11->pLimit == (Expr *)0x0 && (pSVar11->pWhere == (Expr *)0x0)))) &&
        (pSVar7 = pSVar11->pSrc, pSVar7->nSrc == 1)) &&
       ((pSVar7->a[0].pSelect == (Select *)0x0 && ((pSVar7->a[0].pTab)->eTabType != '\x01')))) {
      lVar21 = (long)pSVar11->pEList->nExpr;
      if (0 < lVar21) {
        lVar22 = 0;
        do {
          if (**(char **)((long)&pSVar11->pEList->a[0].pExpr + lVar22) != -0x59) goto LAB_0016b054;
          lVar22 = lVar22 + 0x18;
        } while (lVar21 * 0x18 != lVar22);
      }
    }
    else {
LAB_0016b054:
      pSVar11 = (Select *)0x0;
    }
    if (pSVar11 != (Select *)0x0) {
      pEVar6 = pSVar11->pEList;
      uVar15 = pEVar6->nExpr;
      pTab = pSVar11->pSrc->a[0].pTab;
      if (pTab->pSchema == (Schema *)0x0) {
        iVar10 = -0x8000;
      }
      else {
        iVar10 = -1;
        ppSVar16 = &pParse->db->aDb->pSchema;
        do {
          iVar10 = iVar10 + 1;
          pSVar8 = *ppSVar16;
          ppSVar16 = ppSVar16 + 4;
        } while (pSVar8 != pTab->pSchema);
      }
      sqlite3CodeVerifySchema(pParse,iVar10);
      sqlite3TableLock(pParse,iVar10,pTab->tnum,'\0',pTab->zName);
      if ((uVar15 == 1) && ((pEVar6->a[0].pExpr)->iColumn < 0)) {
        iVar20 = sqlite3VdbeAddOp3(p,0xe,0,0,0);
        sqlite3OpenTable(pParse,iCur,iVar10,pTab,0x70);
        sqlite3VdbeExplain(pParse,'\0',"USING ROWID SEARCH ON TABLE %s FOR IN-OPERATOR",pTab->zName)
        ;
        if (p->db->mallocFailed == '\0') {
          iVar10 = p->nOp + -1;
          if (-1 < iVar20) {
            iVar10 = iVar20;
          }
          pOVar18 = p->aOp + iVar10;
        }
        else {
          pOVar18 = (Op *)&sqlite3VdbeGetOp_dummy;
        }
        pOVar18->p2 = p->nOp;
        iVar20 = 1;
      }
      else {
        if ((int)uVar15 < 1) {
LAB_0016b2be:
          pIdx = pTab->pIndex;
          if (pIdx != (Index *)0x0) {
            do {
              uVar4 = pIdx->nColumn;
              iVar20 = 0;
              if (((((int)uVar15 <= (int)(uint)uVar4) && (iVar20 = 0, uVar4 < 0x3f)) &&
                  (iVar20 = 0, pIdx->pPartIdxWhere == (Expr *)0x0)) &&
                 (((inFlags & 4) == 0 ||
                  ((iVar20 = 0, (int)(uint)pIdx->nKeyCol <= (int)uVar15 &&
                   (((int)(uint)uVar4 <= (int)uVar15 || (iVar20 = 0, pIdx->onError != '\0')))))))) {
                if (0 < (int)uVar15) {
                  lVar21 = 0;
                  uVar25 = 0;
LAB_0016b34f:
                  pLeft = sqlite3VectorFieldSubexpr(pX->pLeft,(int)lVar21);
                  pEVar12 = pEVar6->a[lVar21].pExpr;
                  pCVar13 = sqlite3BinaryCompareCollSeq(pParse,pLeft,pEVar12);
                  uVar17 = 0;
LAB_0016b388:
                  if (pIdx->aiColumn[uVar17] != pEVar12->iColumn) goto LAB_0016b3cb;
                  if (pCVar13 != (CollSeq *)0x0) {
                    lVar22 = 0;
                    do {
                      bVar1 = pCVar13->zName[lVar22];
                      bVar2 = pIdx->azColl[uVar17][lVar22];
                      if (bVar1 == bVar2) {
                        if ((ulong)bVar1 == 0) goto LAB_0016b3c6;
                      }
                      else if (""[bVar1] != ""[bVar2]) goto LAB_0016b3c6;
                      lVar22 = lVar22 + 1;
                    } while( true );
                  }
                  goto LAB_0016b3d6;
                }
                uVar25 = 0;
LAB_0016b446:
                iVar20 = 0;
                if ((uVar25 ^ -1L << ((byte)uVar15 & 0x3f)) == 0xffffffffffffffff) {
                  iVar20 = sqlite3VdbeAddOp3(p,0xe,0,0,0);
                  sqlite3VdbeExplain(pParse,'\0',"USING INDEX %s FOR IN-OPERATOR",pIdx->zName);
                  sqlite3VdbeAddOp3(p,0x70,iCur,pIdx->tnum,iVar10);
                  sqlite3VdbeSetP4KeyInfo(pParse,pIdx);
                  bVar1 = *pIdx->aSortOrder;
                  if (local_a8 != (int *)0x0) {
                    iVar19 = pParse->nMem + 1;
                    pParse->nMem = iVar19;
                    *local_a8 = iVar19;
                    if (uVar15 == 1) {
                      sqlite3SetHasNullFlag(p,iCur,iVar19);
                    }
                  }
                  pOVar18 = (Op *)&sqlite3VdbeGetOp_dummy;
                  if (p->db->mallocFailed == '\0') {
                    iVar19 = p->nOp + -1;
                    if (-1 < iVar20) {
                      iVar19 = iVar20;
                    }
                    pOVar18 = p->aOp + iVar19;
                  }
                  iVar20 = bVar1 + 3;
                  pOVar18->p2 = p->nOp;
                }
              }
              pIdx = pIdx->pNext;
            } while ((pIdx != (Index *)0x0) && (iVar20 == 0));
            goto LAB_0016afe0;
          }
        }
        else {
          pEVar23 = pEVar6->a;
          uVar25 = 0;
          do {
            pEVar12 = sqlite3VectorFieldSubexpr(pX->pLeft,(int)uVar25);
            sVar3 = pEVar23->pExpr->iColumn;
            aff2 = 'D';
            if ((-1 < (long)sVar3) && (sVar3 < pTab->nCol)) {
              aff2 = pTab->aCol[sVar3].affinity;
            }
            cVar9 = sqlite3CompareAffinity(pEVar12,aff2);
            bVar26 = (byte)(cVar9 + 0xbfU) < 2;
            uVar25 = uVar25 + 1;
          } while ((uVar25 < uVar15) && (pEVar23 = pEVar23 + 1, 'B' < aff2 || bVar26));
          if ('B' < aff2 || bVar26) goto LAB_0016b2be;
        }
        iVar20 = 0;
      }
    }
  }
LAB_0016afe0:
  if (((iVar20 == 0) && (iVar20 = 0, (inFlags & 1) != 0)) && ((pX->flags & 0x1000) == 0)) {
    pEVar12 = pX->pLeft;
    pX->pLeft = (Expr *)0x0;
    local_60.eCode = 1;
    local_60.xExprCallback = exprNodeIsConstant;
    local_60.xSelectCallback = sqlite3SelectWalkFail;
    local_60.u.n = 0;
    if (pX != (Expr *)0x0) {
      walkExpr(&local_60,pX);
    }
    pX->pLeft = pEVar12;
    if ((local_60.eCode == 0) || (((pX->x).pList)->nExpr < 3)) {
      pParse->nTab = pParse->nTab + -1;
      iVar20 = 5;
      iCur = -1;
    }
  }
  if (iVar20 == 0) {
    uVar5 = pParse->nQueryLoop;
    if ((inFlags & 4) == 0) {
      if (local_a8 == (int *)0x0) goto LAB_0016b173;
      iVar20 = pParse->nMem + 1;
      pParse->nMem = iVar20;
      *local_a8 = iVar20;
    }
    else {
      pParse->nQueryLoop = 0;
LAB_0016b173:
      iVar20 = 0;
    }
    sqlite3CodeRhsOfIN(pParse,pX,iCur);
    if (iVar20 != 0) {
      sqlite3SetHasNullFlag(p,iCur,iVar20);
    }
    pParse->nQueryLoop = uVar5;
    iVar20 = 2;
  }
  if ((aiMap == (int *)0x0) || (0xfffffffd < iVar20 - 5U)) goto LAB_0016b1f1;
  pSVar11 = (Select *)pX->pLeft;
  uVar14 = pSVar11->op;
  if (uVar14 == 0xb0) {
    uVar14 = *(u8 *)&pSVar11->nSelectRow;
  }
  if (uVar14 == 0xb1) {
LAB_0016b1d7:
    uVar15 = ((anon_union_8_2_a01b6dbf_for_x *)&pSVar11->pEList)->pList->nExpr;
  }
  else {
    uVar15 = 1;
    if (uVar14 == 0x8a) {
      pSVar11 = ((anon_union_8_2_a01b6dbf_for_x *)&pSVar11->pEList)->pSelect;
      goto LAB_0016b1d7;
    }
  }
  if (0 < (int)uVar15) {
    uVar25 = 0;
    do {
      aiMap[uVar25] = (int)uVar25;
      uVar25 = uVar25 + 1;
    } while (uVar15 != uVar25);
  }
LAB_0016b1f1:
  *piTab = iCur;
  return iVar20;
LAB_0016b3c6:
  if (bVar1 == bVar2) goto LAB_0016b3d6;
LAB_0016b3cb:
  uVar17 = uVar17 + 1;
  if (uVar17 == uVar15) goto code_r0x0016b3d3;
  goto LAB_0016b388;
code_r0x0016b3d3:
  uVar17 = (ulong)uVar15;
LAB_0016b3d6:
  if (((uint)uVar17 == uVar15) || ((uVar25 >> (uVar17 & 0x3f) & 1) != 0)) {
    bVar26 = false;
  }
  else {
    uVar25 = uVar25 | 1L << ((byte)uVar17 & 0x3f);
    bVar26 = true;
    if (aiMap != (int *)0x0) {
      aiMap[lVar21] = (uint)uVar17;
    }
  }
  if ((!bVar26) || (lVar21 = lVar21 + 1, (int)uVar15 <= lVar21)) goto LAB_0016b446;
  goto LAB_0016b34f;
}

Assistant:

SQLITE_PRIVATE int sqlite3FindInIndex(
  Parse *pParse,             /* Parsing context */
  Expr *pX,                  /* The IN expression */
  u32 inFlags,               /* IN_INDEX_LOOP, _MEMBERSHIP, and/or _NOOP_OK */
  int *prRhsHasNull,         /* Register holding NULL status.  See notes */
  int *aiMap,                /* Mapping from Index fields to RHS fields */
  int *piTab                 /* OUT: index to use */
){
  Select *p;                            /* SELECT to the right of IN operator */
  int eType = 0;                        /* Type of RHS table. IN_INDEX_* */
  int iTab;                             /* Cursor of the RHS table */
  int mustBeUnique;                     /* True if RHS must be unique */
  Vdbe *v = sqlite3GetVdbe(pParse);     /* Virtual machine being coded */

  assert( pX->op==TK_IN );
  mustBeUnique = (inFlags & IN_INDEX_LOOP)!=0;
  iTab = pParse->nTab++;

  /* If the RHS of this IN(...) operator is a SELECT, and if it matters
  ** whether or not the SELECT result contains NULL values, check whether
  ** or not NULL is actually possible (it may not be, for example, due
  ** to NOT NULL constraints in the schema). If no NULL values are possible,
  ** set prRhsHasNull to 0 before continuing.  */
  if( prRhsHasNull && ExprUseXSelect(pX) ){
    int i;
    ExprList *pEList = pX->x.pSelect->pEList;
    for(i=0; i<pEList->nExpr; i++){
      if( sqlite3ExprCanBeNull(pEList->a[i].pExpr) ) break;
    }
    if( i==pEList->nExpr ){
      prRhsHasNull = 0;
    }
  }

  /* Check to see if an existing table or index can be used to
  ** satisfy the query.  This is preferable to generating a new
  ** ephemeral table.  */
  if( pParse->nErr==0 && (p = isCandidateForInOpt(pX))!=0 ){
    sqlite3 *db = pParse->db;              /* Database connection */
    Table *pTab;                           /* Table <table>. */
    int iDb;                               /* Database idx for pTab */
    ExprList *pEList = p->pEList;
    int nExpr = pEList->nExpr;

    assert( p->pEList!=0 );             /* Because of isCandidateForInOpt(p) */
    assert( p->pEList->a[0].pExpr!=0 ); /* Because of isCandidateForInOpt(p) */
    assert( p->pSrc!=0 );               /* Because of isCandidateForInOpt(p) */
    pTab = p->pSrc->a[0].pTab;

    /* Code an OP_Transaction and OP_TableLock for <table>. */
    iDb = sqlite3SchemaToIndex(db, pTab->pSchema);
    assert( iDb>=0 && iDb<SQLITE_MAX_DB );
    sqlite3CodeVerifySchema(pParse, iDb);
    sqlite3TableLock(pParse, iDb, pTab->tnum, 0, pTab->zName);

    assert(v);  /* sqlite3GetVdbe() has always been previously called */
    if( nExpr==1 && pEList->a[0].pExpr->iColumn<0 ){
      /* The "x IN (SELECT rowid FROM table)" case */
      int iAddr = sqlite3VdbeAddOp0(v, OP_Once);
      VdbeCoverage(v);

      sqlite3OpenTable(pParse, iTab, iDb, pTab, OP_OpenRead);
      eType = IN_INDEX_ROWID;
      ExplainQueryPlan((pParse, 0,
            "USING ROWID SEARCH ON TABLE %s FOR IN-OPERATOR",pTab->zName));
      sqlite3VdbeJumpHere(v, iAddr);
    }else{
      Index *pIdx;                         /* Iterator variable */
      int affinity_ok = 1;
      int i;

      /* Check that the affinity that will be used to perform each
      ** comparison is the same as the affinity of each column in table
      ** on the RHS of the IN operator.  If it not, it is not possible to
      ** use any index of the RHS table.  */
      for(i=0; i<nExpr && affinity_ok; i++){
        Expr *pLhs = sqlite3VectorFieldSubexpr(pX->pLeft, i);
        int iCol = pEList->a[i].pExpr->iColumn;
        char idxaff = sqlite3TableColumnAffinity(pTab,iCol); /* RHS table */
        char cmpaff = sqlite3CompareAffinity(pLhs, idxaff);
        testcase( cmpaff==SQLITE_AFF_BLOB );
        testcase( cmpaff==SQLITE_AFF_TEXT );
        switch( cmpaff ){
          case SQLITE_AFF_BLOB:
            break;
          case SQLITE_AFF_TEXT:
            /* sqlite3CompareAffinity() only returns TEXT if one side or the
            ** other has no affinity and the other side is TEXT.  Hence,
            ** the only way for cmpaff to be TEXT is for idxaff to be TEXT
            ** and for the term on the LHS of the IN to have no affinity. */
            assert( idxaff==SQLITE_AFF_TEXT );
            break;
          default:
            affinity_ok = sqlite3IsNumericAffinity(idxaff);
        }
      }

      if( affinity_ok ){
        /* Search for an existing index that will work for this IN operator */
        for(pIdx=pTab->pIndex; pIdx && eType==0; pIdx=pIdx->pNext){
          Bitmask colUsed;      /* Columns of the index used */
          Bitmask mCol;         /* Mask for the current column */
          if( pIdx->nColumn<nExpr ) continue;
          if( pIdx->pPartIdxWhere!=0 ) continue;
          /* Maximum nColumn is BMS-2, not BMS-1, so that we can compute
          ** BITMASK(nExpr) without overflowing */
          testcase( pIdx->nColumn==BMS-2 );
          testcase( pIdx->nColumn==BMS-1 );
          if( pIdx->nColumn>=BMS-1 ) continue;
          if( mustBeUnique ){
            if( pIdx->nKeyCol>nExpr
             ||(pIdx->nColumn>nExpr && !IsUniqueIndex(pIdx))
            ){
              continue;  /* This index is not unique over the IN RHS columns */
            }
          }

          colUsed = 0;   /* Columns of index used so far */
          for(i=0; i<nExpr; i++){
            Expr *pLhs = sqlite3VectorFieldSubexpr(pX->pLeft, i);
            Expr *pRhs = pEList->a[i].pExpr;
            CollSeq *pReq = sqlite3BinaryCompareCollSeq(pParse, pLhs, pRhs);
            int j;

            assert( pReq!=0 || pRhs->iColumn==XN_ROWID || pParse->nErr );
            for(j=0; j<nExpr; j++){
              if( pIdx->aiColumn[j]!=pRhs->iColumn ) continue;
              assert( pIdx->azColl[j] );
              if( pReq!=0 && sqlite3StrICmp(pReq->zName, pIdx->azColl[j])!=0 ){
                continue;
              }
              break;
            }
            if( j==nExpr ) break;
            mCol = MASKBIT(j);
            if( mCol & colUsed ) break; /* Each column used only once */
            colUsed |= mCol;
            if( aiMap ) aiMap[i] = j;
          }

          assert( i==nExpr || colUsed!=(MASKBIT(nExpr)-1) );
          if( colUsed==(MASKBIT(nExpr)-1) ){
            /* If we reach this point, that means the index pIdx is usable */
            int iAddr = sqlite3VdbeAddOp0(v, OP_Once); VdbeCoverage(v);
            ExplainQueryPlan((pParse, 0,
                              "USING INDEX %s FOR IN-OPERATOR",pIdx->zName));
            sqlite3VdbeAddOp3(v, OP_OpenRead, iTab, pIdx->tnum, iDb);
            sqlite3VdbeSetP4KeyInfo(pParse, pIdx);
            VdbeComment((v, "%s", pIdx->zName));
            assert( IN_INDEX_INDEX_DESC == IN_INDEX_INDEX_ASC+1 );
            eType = IN_INDEX_INDEX_ASC + pIdx->aSortOrder[0];

            if( prRhsHasNull ){
#ifdef SQLITE_ENABLE_COLUMN_USED_MASK
              i64 mask = (1<<nExpr)-1;
              sqlite3VdbeAddOp4Dup8(v, OP_ColumnsUsed,
                  iTab, 0, 0, (u8*)&mask, P4_INT64);
#endif
              *prRhsHasNull = ++pParse->nMem;
              if( nExpr==1 ){
                sqlite3SetHasNullFlag(v, iTab, *prRhsHasNull);
              }
            }
            sqlite3VdbeJumpHere(v, iAddr);
          }
        } /* End loop over indexes */
      } /* End if( affinity_ok ) */
    } /* End if not an rowid index */
  } /* End attempt to optimize using an index */

  /* If no preexisting index is available for the IN clause
  ** and IN_INDEX_NOOP is an allowed reply
  ** and the RHS of the IN operator is a list, not a subquery
  ** and the RHS is not constant or has two or fewer terms,
  ** then it is not worth creating an ephemeral table to evaluate
  ** the IN operator so return IN_INDEX_NOOP.
  */
  if( eType==0
   && (inFlags & IN_INDEX_NOOP_OK)
   && ExprUseXList(pX)
   && (!sqlite3InRhsIsConstant(pX) || pX->x.pList->nExpr<=2)
  ){
    pParse->nTab--;  /* Back out the allocation of the unused cursor */
    iTab = -1;       /* Cursor is not allocated */
    eType = IN_INDEX_NOOP;
  }

  if( eType==0 ){
    /* Could not find an existing table or index to use as the RHS b-tree.
    ** We will have to generate an ephemeral table to do the job.
    */
    u32 savedNQueryLoop = pParse->nQueryLoop;
    int rMayHaveNull = 0;
    eType = IN_INDEX_EPH;
    if( inFlags & IN_INDEX_LOOP ){
      pParse->nQueryLoop = 0;
    }else if( prRhsHasNull ){
      *prRhsHasNull = rMayHaveNull = ++pParse->nMem;
    }
    assert( pX->op==TK_IN );
    sqlite3CodeRhsOfIN(pParse, pX, iTab);
    if( rMayHaveNull ){
      sqlite3SetHasNullFlag(v, iTab, rMayHaveNull);
    }
    pParse->nQueryLoop = savedNQueryLoop;
  }

  if( aiMap && eType!=IN_INDEX_INDEX_ASC && eType!=IN_INDEX_INDEX_DESC ){
    int i, n;
    n = sqlite3ExprVectorSize(pX->pLeft);
    for(i=0; i<n; i++) aiMap[i] = i;
  }
  *piTab = iTab;
  return eType;
}